

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.hpp
# Opt level: O2

char * httplib::detail::find_content_type
                 (string *path,
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *user_data)

{
  uint uVar1;
  const_iterator cVar2;
  char *pcVar3;
  string ext;
  string local_30;
  
  file_extension(&local_30,path);
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&user_data->_M_t,&local_30);
  if ((_Rb_tree_header *)cVar2._M_node != &(user_data->_M_t)._M_impl.super__Rb_tree_header) {
    pcVar3 = *(char **)(cVar2._M_node + 2);
    goto LAB_0011ecb5;
  }
  uVar1 = str2tag(&local_30);
  if (uVar1 == 0x76d) {
    pcVar3 = "application/x-7z-compressed";
    goto LAB_0011ecb5;
  }
  if (uVar1 == 0xd3d) {
    pcVar3 = "application/gzip";
    goto LAB_0011ecb5;
  }
  if (uVar1 != 0xdd9) {
    if (uVar1 == 0x859114a) {
      pcVar3 = "font/woff2";
      goto LAB_0011ecb5;
    }
    if (uVar1 == 0x1a2c6) {
      pcVar3 = "text/csv";
      goto LAB_0011ecb5;
    }
    if (uVar1 == 0x1a6df) {
      pcVar3 = "image/bmp";
      goto LAB_0011ecb5;
    }
    if (uVar1 == 0x1b0f1) {
LAB_0011eedc:
      pcVar3 = "text/html";
      goto LAB_0011ecb5;
    }
    if (uVar1 == 0x1b288) {
      pcVar3 = "image/gif";
      goto LAB_0011ecb5;
    }
    if (uVar1 == 0x1c97d) {
LAB_0011eeb8:
      pcVar3 = "image/jpeg";
      goto LAB_0011ecb5;
    }
    if (uVar1 == 0x1cb45) {
      pcVar3 = "image/x-icon";
      goto LAB_0011ecb5;
    }
    if (uVar1 == 0x1d0f2) {
      pcVar3 = "application/pdf";
      goto LAB_0011ecb5;
    }
    if (uVar1 == 0x1d1b9) {
      pcVar3 = "image/png";
      goto LAB_0011ecb5;
    }
    if (uVar1 == 0x1d5fd) {
      pcVar3 = "font/otf";
      goto LAB_0011ecb5;
    }
    if (uVar1 != 0x1db34) {
      if (uVar1 == 0x1de29) {
        pcVar3 = "video/mp4";
        goto LAB_0011ecb5;
      }
      if (uVar1 == 0x1de2e) {
        pcVar3 = "audio/mp3";
        goto LAB_0011ecb5;
      }
      if (uVar1 == 0x1dee6) {
        pcVar3 = "font/ttf";
        goto LAB_0011ecb5;
      }
      if (uVar1 == 0x1e078) {
        pcVar3 = "text/plain";
        goto LAB_0011ecb5;
      }
      if (uVar1 == 0x1e147) {
        pcVar3 = "application/x-tar";
        goto LAB_0011ecb5;
      }
      if (uVar1 == 0x1e25b) {
LAB_0011eed0:
        pcVar3 = "image/tiff";
      }
      else {
        if (uVar1 == 0x1e322) {
          pcVar3 = "image/svg+xml";
          goto LAB_0011ecb5;
        }
        if (uVar1 == 0x1e692) {
          pcVar3 = "application/rss+xml";
          goto LAB_0011ecb5;
        }
        if (uVar1 != 0x1f164) {
          if (uVar1 == 0x1f1d9) {
            pcVar3 = "application/xml";
            goto LAB_0011ecb5;
          }
          if (uVar1 == 0x1f580) {
            pcVar3 = "audio/wave";
            goto LAB_0011ecb5;
          }
          if (uVar1 == 0x1f7f6) {
            pcVar3 = "text/vtt";
            goto LAB_0011ecb5;
          }
          if (uVar1 == 0x20a43) {
            pcVar3 = "application/zip";
            goto LAB_0011ecb5;
          }
          if (uVar1 == 0x371b38) {
            pcVar3 = "image/apng";
            goto LAB_0011ecb5;
          }
          if (uVar1 == 0x372318) {
            pcVar3 = "image/avif";
            goto LAB_0011ecb5;
          }
          if (uVar1 == 0x372b57) {
            pcVar3 = "application/atom+xml";
            goto LAB_0011ecb5;
          }
          if (uVar1 == 0x37cf7d) goto LAB_0011eedc;
          if (uVar1 == 0x3adb38) {
            pcVar3 = "application/json";
            goto LAB_0011ecb5;
          }
          if (uVar1 == 0x3af938) goto LAB_0011eeb8;
          if (uVar1 == 0x3dad1f) {
            pcVar3 = "video/mpeg";
            goto LAB_0011ecb5;
          }
          if (uVar1 == 0x3daddb) {
            pcVar3 = "audio/mpeg";
            goto LAB_0011ecb5;
          }
          if (uVar1 == 0x3e2ddd) goto LAB_0011eed0;
          if (uVar1 == 0x3ff093) {
            pcVar3 = "application/xslt+xml";
            goto LAB_0011ecb5;
          }
          if (uVar1 == 0x409760) {
            pcVar3 = "image/webp";
            goto LAB_0011ecb5;
          }
          if (uVar1 == 0x409771) {
            pcVar3 = "audio/webm";
            goto LAB_0011ecb5;
          }
          if (uVar1 == 0x40977d) {
            pcVar3 = "video/webm";
            goto LAB_0011ecb5;
          }
          if (uVar1 == 0x40a648) {
            pcVar3 = "application/wasm";
            goto LAB_0011ecb5;
          }
          if (uVar1 == 0x40c278) {
            pcVar3 = "font/woff";
            goto LAB_0011ecb5;
          }
          if (uVar1 != 0x843cec5) {
            if (uVar1 == 0x1a2c3) {
              pcVar3 = "text/css";
            }
            else {
              pcVar3 = (char *)0x0;
            }
            goto LAB_0011ecb5;
          }
        }
        pcVar3 = "application/xhtml+xml";
      }
      goto LAB_0011ecb5;
    }
  }
  pcVar3 = "application/javascript";
LAB_0011ecb5:
  std::__cxx11::string::~string((string *)&local_30);
  return pcVar3;
}

Assistant:

inline const char*
            find_content_type(const std::string& path,
                const std::map<std::string, std::string>& user_data) {
            auto ext = file_extension(path);

            auto it = user_data.find(ext);
            if (it != user_data.end()) { return it->second.c_str(); }

            using udl::operator""_;

            switch (str2tag(ext)) {
            default: return nullptr;
            case "css"_: return "text/css";
            case "csv"_: return "text/csv";
            case "txt"_: return "text/plain";
            case "vtt"_: return "text/vtt";
            case "htm"_:
            case "html"_: return "text/html";

            case "apng"_: return "image/apng";
            case "avif"_: return "image/avif";
            case "bmp"_: return "image/bmp";
            case "gif"_: return "image/gif";
            case "png"_: return "image/png";
            case "svg"_: return "image/svg+xml";
            case "webp"_: return "image/webp";
            case "ico"_: return "image/x-icon";
            case "tif"_: return "image/tiff";
            case "tiff"_: return "image/tiff";
            case "jpg"_:
            case "jpeg"_: return "image/jpeg";

            case "mp4"_: return "video/mp4";
            case "mpeg"_: return "video/mpeg";
            case "webm"_: return "video/webm";

            case "mp3"_: return "audio/mp3";
            case "mpga"_: return "audio/mpeg";
            case "weba"_: return "audio/webm";
            case "wav"_: return "audio/wave";

            case "otf"_: return "font/otf";
            case "ttf"_: return "font/ttf";
            case "woff"_: return "font/woff";
            case "woff2"_: return "font/woff2";

            case "7z"_: return "application/x-7z-compressed";
            case "atom"_: return "application/atom+xml";
            case "pdf"_: return "application/pdf";
            case "js"_:
            case "mjs"_: return "application/javascript";
            case "json"_: return "application/json";
            case "rss"_: return "application/rss+xml";
            case "tar"_: return "application/x-tar";
            case "xht"_:
            case "xhtml"_: return "application/xhtml+xml";
            case "xslt"_: return "application/xslt+xml";
            case "xml"_: return "application/xml";
            case "gz"_: return "application/gzip";
            case "zip"_: return "application/zip";
            case "wasm"_: return "application/wasm";
            }
        }